

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<unsigned_long,_true,_long>::BitpackingWriter::WriteDeltaFor
               (unsigned_long *values,bool *validity,bitpacking_width_t width,
               unsigned_long frame_of_reference,long delta_offset,unsigned_long *original_values,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar7;
  ulong uVar8;
  unsigned_long *in;
  ulong uVar9;
  unsigned_long *puVar10;
  ulong uVar11;
  uint64_t local_138 [33];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar9 = (ulong)width;
  uVar6 = iVar5 * uVar9 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_long,_true,_long> *)data_ptr,uVar6 + 0x18,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x4000000;
  puVar10 = *(unsigned_long **)((long)data_ptr + 0x40);
  *puVar10 = frame_of_reference;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar10 + 1;
  puVar10[1] = uVar9;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar10 + 2;
  puVar10[2] = delta_offset;
  puVar10 = puVar10 + 3;
  *(unsigned_long **)((long)data_ptr + 0x40) = puVar10;
  uVar11 = count & 0xffffffffffffffe0;
  if (uVar11 != 0) {
    uVar8 = 0;
    uVar7 = 0;
    in = values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar8 >> 3) + (long)puVar10),(uint)width);
      uVar7 = uVar7 + 0x20;
      in = in + 0x20;
      uVar8 = uVar8 + (ulong)width * 0x20;
    } while (uVar7 < uVar11);
  }
  if ((count & 0x1f) != 0) {
    uVar7 = (ulong)(((uint)count & 0x1f) << 3);
    switchD_005700f1::default((void *)((long)local_138 + uVar7),0,0x100 - uVar7);
    switchD_00b1422a::default(local_138,values + uVar11,uVar7);
    duckdb_fastpforlib::fastpack
              (local_138,(uint32_t *)((long)puVar10 + (uVar9 * uVar11 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<unsigned_long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}